

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingQtWriter.cpp
# Opt level: O3

QRect * ZXingQt::WriteBarcode(QStringView text,BarcodeFormat format)

{
  undefined8 *puVar1;
  undefined4 in_register_00000014;
  Matrix<unsigned_char> bitmap;
  MultiFormatWriter writer;
  BitMatrix matrix;
  Matrix<unsigned_char> local_90;
  QString local_70;
  QString local_58;
  undefined1 local_40 [4];
  undefined1 local_3c;
  undefined8 local_38;
  string local_30 [8];
  void *local_28;
  long local_18;
  
  local_3c = 0;
  local_38 = 0xffffffffffffffff;
  QString::QString(&local_58,(QChar *)CONCAT44(in_register_00000014,format),(longlong)text.m_data);
  QString::toUtf8_helper(&local_70);
  if (local_70.d.ptr == (char16_t *)0x0) {
    local_70.d.ptr = (char16_t *)&QByteArray::_empty;
  }
  puVar1 = &local_90._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_90._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,local_70.d.ptr,local_70.d.size + (long)local_70.d.ptr);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,8);
    }
  }
  ZXing::MultiFormatWriter::encode(local_30,(int)local_40,(int)&local_90);
  if ((undefined8 *)local_90._0_8_ != puVar1) {
    operator_delete((void *)local_90._0_8_,
                    (ulong)(local_90._data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1));
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  ZXing::ToMatrix<unsigned_char>(&local_90,(BitMatrix *)local_30,'\0',0xff);
  QImage::QImage((QImage *)&local_70,
                 local_90._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,local_90._width,local_90._height,
                 (long)local_90._width,Format_Grayscale8,(_func_void_void_ptr *)0x0,(void *)0x0);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0xffffffffffffffff;
  QImage::copy((QRect *)text.m_size);
  QImage::~QImage((QImage *)&local_70);
  if (local_90._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_90._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90._data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_28 != (void *)0x0) {
    operator_delete(local_28,local_18 - (long)local_28);
  }
  return (QRect *)text.m_size;
}

Assistant:

QImage WriteBarcode(QStringView text, ZXing::BarcodeFormat format)
{
	using namespace ZXing;

#ifdef ZXING_EXPERIMENTAL_API
	auto barcode = CreateBarcodeFromText(text.toString().toStdString(), format);
	auto bitmap = WriteBarcodeToImage(barcode);
#else
	auto writer = MultiFormatWriter(format);
	auto matrix = writer.encode(text.toString().toStdString(), 0, 0);
	auto bitmap = ToMatrix<uint8_t>(matrix);
#endif
	return QImage(bitmap.data(), bitmap.width(), bitmap.height(), bitmap.width(), QImage::Format::Format_Grayscale8).copy();
}